

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::refine_solution(dxt1_endpoint_optimizer *this,int refinement_level)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  unique_color *puVar13;
  unique_color *puVar14;
  byte *pbVar15;
  uchar *puVar16;
  color_quad<unsigned_char,_int> *local_1b0;
  color_quad<unsigned_char,_int> *local_190;
  color_quad<unsigned_char,_int> *local_170;
  color_quad<unsigned_char,_int> *local_150;
  int local_130;
  int local_12c;
  int br_1;
  int gr_1;
  int rr_1;
  color_quad_u8 c_2 [2];
  dxt1_solution_coordinates nc_2;
  int obr;
  int ogr;
  int orr;
  color_quad_u8 e_1 [2];
  color_quad_u8 c_1 [2];
  dxt1_solution_coordinates nc_1;
  int br;
  int gr;
  int rr;
  uint i_1;
  color_quad_u8 e [2];
  dxt1_solution_coordinates nc;
  uint min16;
  uint max16;
  bool improved;
  double fg;
  double frb;
  double t;
  double xy;
  double yy;
  double xx;
  int w1;
  int step;
  double b;
  double g;
  double r;
  double weight;
  color_quad_u8 *c;
  double dStack_68;
  uint i;
  double At2_b;
  double At2_g;
  double At2_r;
  double At1_b;
  double At1_g;
  double At1_r;
  double akku_2;
  double akku_1;
  double akku_0;
  int refinement_level_local;
  dxt1_endpoint_optimizer *this_local;
  
  compute_selectors(this);
  akku_1 = 0.0;
  akku_2 = 0.0;
  At1_r = 0.0;
  At2_r = 0.0;
  At1_b = 0.0;
  At1_g = 0.0;
  dStack_68 = 0.0;
  At2_b = 0.0;
  At2_g = 0.0;
  for (c._4_4_ = 0; uVar7 = vector<crnlib::unique_color>::size(&this->m_unique_colors),
      c._4_4_ < uVar7; c._4_4_ = c._4_4_ + 1) {
    puVar13 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,c._4_4_);
    puVar14 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,c._4_4_);
    dVar1 = (double)puVar14->m_weight;
    dVar2 = (double)(puVar13->m_color).field_0.field_0.r * dVar1;
    dVar3 = (double)(puVar13->m_color).field_0.field_0.g * dVar1;
    dVar4 = (double)(puVar13->m_color).field_0.field_0.b * dVar1;
    pbVar15 = vector<unsigned_char>::operator[](&(this->m_best_solution).m_selectors,c._4_4_);
    uVar8 = *pbVar15 ^ 1;
    iVar9 = refine_solution::w1Tab[(int)uVar8];
    akku_1 = (double)refine_solution::prods_0[(int)uVar8] * dVar1 + akku_1;
    akku_2 = (double)refine_solution::prods_1[(int)uVar8] * dVar1 + akku_2;
    At1_r = (double)refine_solution::prods_2[(int)uVar8] * dVar1 + At1_r;
    At1_g = (double)iVar9 * dVar2 + At1_g;
    At1_b = (double)iVar9 * dVar3 + At1_b;
    At2_r = (double)iVar9 * dVar4 + At2_r;
    At2_g = dVar2 + At2_g;
    At2_b = dVar3 + At2_b;
    dStack_68 = dVar4 + dStack_68;
  }
  dVar1 = At2_g * 3.0 + -At1_g;
  dVar2 = At2_b * 3.0 + -At1_b;
  dVar3 = dStack_68 * 3.0 + -At2_r;
  dVar4 = At1_r * akku_2 + -(akku_1 * akku_1);
  if ((((akku_2 == 0.0) && (!NAN(akku_2))) || ((At1_r == 0.0 && (!NAN(At1_r))))) ||
     (ABS(dVar4) < 1.249999968422344e-05)) {
    this_local._7_1_ = false;
  }
  else {
    dVar4 = 0.364705890417099 / dVar4;
    dVar5 = dVar4 * 2.0322580337524414;
    this_local._7_1_ = false;
    if (refinement_level == 0) {
      iVar9 = math::clamp<int>((int)((At1_g * akku_2 + -(dVar1 * akku_1)) * dVar4 + 0.5),0,0x1f);
      iVar10 = math::clamp<int>((int)((At1_b * akku_2 + -(dVar2 * akku_1)) * dVar5 + 0.5),0,0x3f);
      iVar11 = math::clamp<int>((int)((At2_r * akku_2 + -(dVar3 * akku_1)) * dVar4 + 0.5),0,0x1f);
      iVar12 = math::clamp<int>((int)((dVar1 * At1_r + -(At1_g * akku_1)) * dVar4 + 0.5),0,0x1f);
      e[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)(iVar12 << 0xb);
      iVar12 = math::clamp<int>((int)((dVar2 * At1_r + -(At1_b * akku_1)) * dVar5 + 0.5),0,0x3f);
      e[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                     (iVar12 << 5 | (uint)e[1].field_0);
      uVar8 = math::clamp<int>((int)((dVar3 * At1_r + -(At2_r * akku_1)) * dVar4 + 0.5),0,0x1f);
      e[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                     (uVar8 | (uint)e[1].field_0);
      dxt1_solution_coordinates::dxt1_solution_coordinates
                ((dxt1_solution_coordinates *)e,SUB42(e[1].field_0.m_u32,0),
                 (ushort)iVar11 | (ushort)(iVar10 << 5) | (ushort)(iVar9 << 0xb));
      dxt1_solution_coordinates::canonicalize((dxt1_solution_coordinates *)e);
      this_local._7_1_ = evaluate_solution(this,(dxt1_solution_coordinates *)e,false);
    }
    else if (refinement_level == 1) {
      local_150 = (color_quad<unsigned_char,_int> *)&rr;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_150);
        local_150 = local_150 + 1;
      } while (local_150 != e);
      color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&rr);
      iVar9 = math::clamp<int>((int)((At1_g * akku_2 + -(dVar1 * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&rr,0);
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((At1_b * akku_2 + -(dVar2 * akku_1)) * dVar5 + 0.5),0,0x3f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&rr,1);
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((At2_r * akku_2 + -(dVar3 * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&rr,2);
      *puVar16 = (uchar)iVar9;
      color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&i_1);
      iVar9 = math::clamp<int>((int)((dVar1 * At1_r + -(At1_g * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&i_1,0)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((dVar2 * At1_r + -(At1_b * akku_1)) * dVar5 + 0.5),0,0x3f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&i_1,1)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((dVar3 * At1_r + -(At2_r * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&i_1,2)
      ;
      *puVar16 = (uchar)iVar9;
      for (gr = 0; (uint)gr < 2; gr = gr + 1) {
        for (br = -1; br < 2; br = br + 1) {
          nc_1.m_low_color = 0xffff;
          nc_1.m_high_color = 0xffff;
          for (; (int)nc_1 < 2; nc_1 = (dxt1_solution_coordinates)((int)nc_1 + 1)) {
            for (c_1[1].field_0 =
                      (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                       )0xffffffff; (int)c_1[1].field_0 < 2;
                c_1[1].field_0 =
                     (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                     ((int)c_1[1].field_0 + 1)) {
              dxt1_solution_coordinates::dxt1_solution_coordinates((dxt1_solution_coordinates *)c_1)
              ;
              local_170 = e_1;
              do {
                color_quad<unsigned_char,_int>::color_quad(local_170);
                local_170 = local_170 + 1;
              } while (local_170 != c_1);
              color_quad<unsigned_char,_int>::operator=(e_1,(color_quad<unsigned_char,_int> *)&rr);
              color_quad<unsigned_char,_int>::operator=
                        (e_1 + 1,(color_quad<unsigned_char,_int> *)&i_1);
              pbVar15 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,0);
              iVar9 = math::clamp<int>((uint)*pbVar15 + br,0,0x1f);
              puVar16 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,0);
              *puVar16 = (uchar)iVar9;
              pbVar15 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,1);
              iVar9 = math::clamp<int>((uint)*pbVar15 + (int)nc_1,0,0x3f);
              puVar16 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,1);
              *puVar16 = (uchar)iVar9;
              pbVar15 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,2);
              iVar9 = math::clamp<int>((uint)*pbVar15 + (int)c_1[1].field_0,0,0x1f);
              puVar16 = color_quad<unsigned_char,_int>::operator[](e_1 + (uint)gr,2);
              *puVar16 = (uchar)iVar9;
              c_1[0].field_0._0_2_ = dxt1_block::pack_color(e_1,false,0x7f);
              c_1[0].field_0._2_2_ = dxt1_block::pack_color(e_1 + 1,false,0x7f);
              dxt1_solution_coordinates::canonicalize((dxt1_solution_coordinates *)c_1);
              bVar6 = evaluate_solution(this,(dxt1_solution_coordinates *)c_1,false);
              this_local._7_1_ = this_local._7_1_ != false || bVar6;
            }
          }
        }
      }
    }
    else {
      local_190 = (color_quad<unsigned_char,_int> *)&ogr;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_190);
        local_190 = local_190 + 1;
      } while (local_190 != e_1);
      color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&ogr);
      iVar9 = math::clamp<int>((int)((At1_g * akku_2 + -(dVar1 * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&ogr,0)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((At1_b * akku_2 + -(dVar2 * akku_1)) * dVar5 + 0.5),0,0x3f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&ogr,1)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((At2_r * akku_2 + -(dVar3 * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&ogr,2)
      ;
      *puVar16 = (uchar)iVar9;
      color_quad<unsigned_char,_int>::clear((color_quad<unsigned_char,_int> *)&orr);
      iVar9 = math::clamp<int>((int)((dVar1 * At1_r + -(At1_g * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&orr,0)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((dVar2 * At1_r + -(At1_b * akku_1)) * dVar5 + 0.5),0,0x3f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&orr,1)
      ;
      *puVar16 = (uchar)iVar9;
      iVar9 = math::clamp<int>((int)((dVar3 * At1_r + -(At2_r * akku_1)) * dVar4 + 0.5),0,0x1f);
      puVar16 = color_quad<unsigned_char,_int>::operator[]((color_quad<unsigned_char,_int> *)&orr,2)
      ;
      *puVar16 = (uchar)iVar9;
      for (obr = -1; obr < 2; obr = obr + 1) {
        nc_2.m_low_color = 0xffff;
        nc_2.m_high_color = 0xffff;
        for (; (int)nc_2 < 2; nc_2 = (dxt1_solution_coordinates)((int)nc_2 + 1)) {
          for (c_2[1].field_0 =
                    (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                    (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                     )0xffffffff; (int)c_2[1].field_0 < 2;
              c_2[1].field_0 =
                   (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   ((int)c_2[1].field_0 + 1)) {
            dxt1_solution_coordinates::dxt1_solution_coordinates((dxt1_solution_coordinates *)c_2);
            local_1b0 = (color_quad<unsigned_char,_int> *)&gr_1;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_1b0);
              local_1b0 = local_1b0 + 1;
            } while (local_1b0 != c_2);
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)&gr_1,
                       (color_quad<unsigned_char,_int> *)&ogr);
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)&rr_1,
                       (color_quad<unsigned_char,_int> *)&orr);
            pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,0);
            iVar9 = math::clamp<int>((uint)*pbVar15 + obr,0,0x1f);
            puVar16 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,0);
            *puVar16 = (uchar)iVar9;
            pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,1);
            iVar9 = math::clamp<int>((uint)*pbVar15 + (int)nc_2,0,0x3f);
            puVar16 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,1);
            *puVar16 = (uchar)iVar9;
            pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,2);
            iVar9 = math::clamp<int>((uint)*pbVar15 + (int)c_2[1].field_0,0,0x1f);
            puVar16 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&gr_1,2);
            *puVar16 = (uchar)iVar9;
            for (br_1 = -1; br_1 < 2; br_1 = br_1 + 1) {
              for (local_12c = -1; local_12c < 2; local_12c = local_12c + 1) {
                for (local_130 = -1; local_130 < 2; local_130 = local_130 + 1) {
                  pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,0);
                  iVar9 = math::clamp<int>((uint)*pbVar15 + br_1,0,0x1f);
                  puVar16 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,0);
                  *puVar16 = (uchar)iVar9;
                  pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,1);
                  iVar9 = math::clamp<int>((uint)*pbVar15 + local_12c,0,0x3f);
                  puVar16 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,1);
                  *puVar16 = (uchar)iVar9;
                  pbVar15 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,2);
                  iVar9 = math::clamp<int>((uint)*pbVar15 + local_130,0,0x1f);
                  puVar16 = color_quad<unsigned_char,_int>::operator[]
                                      ((color_quad<unsigned_char,_int> *)&rr_1,2);
                  *puVar16 = (uchar)iVar9;
                  c_2[0].field_0._0_2_ = dxt1_block::pack_color((color_quad_u8 *)&gr_1,false,0x7f);
                  c_2[0].field_0._2_2_ = dxt1_block::pack_color((color_quad_u8 *)&rr_1,false,0x7f);
                  dxt1_solution_coordinates::canonicalize((dxt1_solution_coordinates *)c_2);
                  bVar6 = evaluate_solution(this,(dxt1_solution_coordinates *)c_2,false);
                  this_local._7_1_ = this_local._7_1_ != false || bVar6;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool dxt1_endpoint_optimizer::refine_solution(int refinement_level)
    {
        compute_selectors();

        static const int w1Tab[4] = { 3, 0, 2, 1 };

        static const int prods_0[4] = { 0x00, 0x00, 0x02, 0x02 };
        static const int prods_1[4] = { 0x00, 0x09, 0x01, 0x04 };
        static const int prods_2[4] = { 0x09, 0x00, 0x04, 0x01 };

        double akku_0 = 0;
        double akku_1 = 0;
        double akku_2 = 0;
        double At1_r, At1_g, At1_b;
        double At2_r, At2_g, At2_b;

        At1_r = At1_g = At1_b = 0;
        At2_r = At2_g = At2_b = 0;
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            const double weight = m_unique_colors[i].m_weight;

            double r = c.r * weight;
            double g = c.g * weight;
            double b = c.b * weight;
            int step = m_best_solution.m_selectors[i] ^ 1;

            int w1 = w1Tab[step];

            akku_0 += prods_0[step] * weight;
            akku_1 += prods_1[step] * weight;
            akku_2 += prods_2[step] * weight;
            At1_r += w1 * r;
            At1_g += w1 * g;
            At1_b += w1 * b;
            At2_r += r;
            At2_g += g;
            At2_b += b;
        }

        At2_r = 3 * At2_r - At1_r;
        At2_g = 3 * At2_g - At1_g;
        At2_b = 3 * At2_b - At1_b;

        double xx = akku_2;
        double yy = akku_1;
        double xy = akku_0;

        double t = xx * yy - xy * xy;
        if (!yy || !xx || (fabs(t) < .0000125f))
        {
            return false;
        }

        double frb = (3.0f * 31.0f / 255.0f) / t;
        double fg = frb * (63.0f / 31.0f);

        bool improved = false;

        if (refinement_level == 0)
        {
            uint max16;
            max16 = math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31) << 11;
            max16 |= math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63) << 5;
            max16 |= math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31) << 0;

            uint min16;
            min16 = math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31) << 11;
            min16 |= math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63) << 5;
            min16 |= math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31) << 0;

            dxt1_solution_coordinates nc((uint16)min16, (uint16)max16);
            nc.canonicalize();
            improved |= evaluate_solution(nc);
        }
        else if (refinement_level == 1)
        {
            // Try exploring the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];

            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (uint i = 0; i < 2; i++)
            {
                for (int rr = -1; rr <= 1; rr++)
                {
                    for (int gr = -1; gr <= 1; gr++)
                    {
                        for (int br = -1; br <= 1; br++)
                        {
                            dxt1_solution_coordinates nc;

                            color_quad_u8 c[2];
                            c[0] = e[0];
                            c[1] = e[1];

                            c[i][0] = (uint8)math::clamp<int>(c[i][0] + rr, 0, 31);
                            c[i][1] = (uint8)math::clamp<int>(c[i][1] + gr, 0, 63);
                            c[i][2] = (uint8)math::clamp<int>(c[i][2] + br, 0, 31);

                            nc.m_low_color = dxt1_block::pack_color(c[0], false);
                            nc.m_high_color = dxt1_block::pack_color(c[1], false);

                            nc.canonicalize();
                            improved |= evaluate_solution(nc);
                        }
                    }
                }
            }
        }
        else
        {
            // Try even harder to explore the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];
            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (int orr = -1; orr <= 1; orr++)
            {
                for (int ogr = -1; ogr <= 1; ogr++)
                {
                    for (int obr = -1; obr <= 1; obr++)
                    {
                        dxt1_solution_coordinates nc;

                        color_quad_u8 c[2];
                        c[0] = e[0];
                        c[1] = e[1];

                        c[0][0] = (uint8)math::clamp<int>(c[0][0] + orr, 0, 31);
                        c[0][1] = (uint8)math::clamp<int>(c[0][1] + ogr, 0, 63);
                        c[0][2] = (uint8)math::clamp<int>(c[0][2] + obr, 0, 31);

                        for (int rr = -1; rr <= 1; rr++)
                        {
                            for (int gr = -1; gr <= 1; gr++)
                            {
                                for (int br = -1; br <= 1; br++)
                                {
                                    c[1][0] = (uint8)math::clamp<int>(c[1][0] + rr, 0, 31);
                                    c[1][1] = (uint8)math::clamp<int>(c[1][1] + gr, 0, 63);
                                    c[1][2] = (uint8)math::clamp<int>(c[1][2] + br, 0, 31);

                                    nc.m_low_color = dxt1_block::pack_color(c[0], false);
                                    nc.m_high_color = dxt1_block::pack_color(c[1], false);
                                    nc.canonicalize();

                                    improved |= evaluate_solution(nc);
                                }
                            }
                        }
                    }
                }
            }
        }

        return improved;
    }